

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::HardSigmoid_x86_avx::forward_inplace
          (HardSigmoid_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [24];
  float *pfVar19;
  long in_RSI;
  long *in_RDI;
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  __m256 _ans_2;
  __m256 _p_2;
  __m256 _one_2;
  __m256 _zero_2;
  int i_2;
  float *ptr_2;
  int q_2;
  __m128 _ans_1;
  __m128 _p_1;
  int i_1;
  __m128 _one_1;
  __m128 _zero_1;
  float *ptr_1;
  int q_1;
  __m256 _ans;
  __m256 _p;
  int i;
  __m256 _one;
  __m256 _zero;
  float *ptr;
  int q;
  int elempack;
  int size;
  int channels;
  int h;
  int w;
  undefined8 in_stack_fffffffffffff608;
  Mat *this_00;
  Mat *in_stack_fffffffffffff610;
  undefined1 local_9c0 [8];
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  int local_92c;
  Mat local_928;
  float *local_8e0;
  int local_8d4;
  undefined1 local_8d0 [8];
  undefined8 uStack_8c8;
  void *local_8c0;
  int *piStack_8b8;
  int local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  Mat local_878;
  Mat *local_830;
  int local_824;
  undefined1 local_820 [8];
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  int local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  Mat local_758;
  float *local_710;
  int local_708;
  int local_704;
  int local_700;
  int local_6fc;
  int local_6f8;
  int local_6f4;
  uint local_6d0;
  uint local_6cc;
  undefined4 local_6c8;
  undefined4 local_6c4;
  uint local_6c0;
  uint local_6bc;
  undefined4 local_6b8;
  undefined4 local_6b4;
  float *local_6b0;
  float *local_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  float *local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  float *local_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float local_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float local_424;
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 local_404;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 local_3ec;
  Mat *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  float local_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  void *local_360;
  int *piStack_358;
  Mat *local_348;
  undefined1 local_340 [16];
  undefined1 auStack_330 [16];
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined4 local_2cc;
  undefined4 local_2c8;
  undefined4 local_2c4;
  undefined1 local_2c0 [16];
  undefined1 auStack_2b0 [16];
  uint local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  uint local_290;
  uint local_28c;
  uint local_288;
  uint local_284;
  undefined1 local_280 [32];
  uint local_260;
  uint local_25c;
  uint local_258;
  uint local_254;
  uint local_250;
  uint local_24c;
  uint local_248;
  uint local_244;
  undefined1 local_240 [16];
  undefined1 auStack_230 [16];
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 local_20c;
  undefined4 local_208;
  undefined4 local_204;
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 local_1dc;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 local_1cc;
  undefined4 local_1c8;
  undefined4 local_1c4;
  undefined1 local_1c0 [16];
  undefined1 auStack_1b0 [16];
  uint local_1a0;
  uint local_19c;
  uint local_198;
  uint local_194;
  uint local_190;
  uint local_18c;
  uint local_188;
  uint local_184;
  undefined1 local_180 [32];
  uint local_160;
  uint local_15c;
  uint local_158;
  uint local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  uint local_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  float local_e0;
  float fStack_dc;
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float fStack_84;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  
  local_6f4 = *(int *)(in_RSI + 0x2c);
  local_6f8 = *(int *)(in_RSI + 0x30);
  local_6fc = *(int *)(in_RSI + 0x38);
  local_700 = local_6f4 * local_6f8;
  local_704 = *(int *)(in_RSI + 0x18);
  if (local_704 == 8) {
    local_704 = 8;
    for (local_708 = 0; local_708 < local_6fc; local_708 = local_708 + 1) {
      Mat::channel(in_stack_fffffffffffff610,(int)((ulong)in_stack_fffffffffffff608 >> 0x20));
      pfVar19 = Mat::operator_cast_to_float_(&local_758);
      Mat::~Mat((Mat *)0x8cdb01);
      local_6b4 = 0;
      local_304 = 0;
      local_308 = 0;
      local_30c = 0;
      local_310 = 0;
      local_314 = 0;
      local_318 = 0;
      local_31c = 0;
      local_320 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_340 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_330 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_7a0 = local_340._0_8_;
      uStack_798 = local_340._8_8_;
      uStack_790 = auStack_330._0_8_;
      uStack_788 = auStack_330._8_8_;
      local_6b8 = 0x3f800000;
      local_2c4 = 0x3f800000;
      local_2c8 = 0x3f800000;
      local_2cc = 0x3f800000;
      local_2d0 = 0x3f800000;
      local_2d4 = 0x3f800000;
      local_2d8 = 0x3f800000;
      local_2dc = 0x3f800000;
      local_2e0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar20._16_16_ = auVar1;
      auVar20._0_16_ = auVar2;
      local_300._0_8_ = auVar2._0_8_;
      local_300._8_8_ = auVar2._8_8_;
      local_300._16_8_ = auVar1._0_8_;
      local_300._24_8_ = auVar1._8_8_;
      local_7c0 = local_300._0_8_;
      uStack_7b8 = local_300._8_8_;
      uStack_7b0 = local_300._16_8_;
      uStack_7a8 = local_300._24_8_;
      local_710 = pfVar19;
      for (local_7c4 = 0; local_7c4 < local_700; local_7c4 = local_7c4 + 1) {
        local_6a8 = local_710;
        local_800 = *(undefined8 *)local_710;
        uStack_7f8 = *(undefined8 *)(local_710 + 2);
        uStack_7f0 = *(undefined8 *)(local_710 + 4);
        uStack_7e8 = *(undefined8 *)(local_710 + 6);
        local_6bc = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_6bc),ZEXT416(local_6bc),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6bc),0x20);
        local_2c0 = vinsertps_avx(auVar1,ZEXT416(local_6bc),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_6bc),ZEXT416(local_6bc),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6bc),0x20);
        auStack_2b0 = vinsertps_avx(auVar1,ZEXT416(local_6bc),0x30);
        local_6c0 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_6c0),ZEXT416(local_6c0),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6c0),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6c0),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_6c0),ZEXT416(local_6c0),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_6c0),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_6c0),0x30);
        auVar21._16_16_ = auVar1;
        auVar21._0_16_ = auVar3;
        local_280._0_8_ = auVar3._0_8_;
        local_620 = local_280._0_8_;
        local_280._8_8_ = auVar3._8_8_;
        uStack_618 = local_280._8_8_;
        local_280._16_8_ = auVar1._0_8_;
        uStack_610 = local_280._16_8_;
        local_280._24_8_ = auVar1._8_8_;
        uStack_608 = local_280._24_8_;
        local_640 = local_2c0._0_8_;
        uStack_638 = local_2c0._8_8_;
        uStack_630 = auStack_2b0._0_8_;
        uStack_628 = auStack_2b0._8_8_;
        local_600._0_4_ = (float)local_800;
        local_a0 = (float)local_600;
        local_600._4_4_ = (float)((ulong)local_800 >> 0x20);
        fStack_9c = local_600._4_4_;
        uStack_5f8._0_4_ = (float)uStack_7f8;
        fStack_98 = (float)uStack_5f8;
        uStack_5f8._4_4_ = (float)((ulong)uStack_7f8 >> 0x20);
        fStack_94 = uStack_5f8._4_4_;
        uStack_5f0._0_4_ = (float)uStack_7f0;
        fStack_90 = (float)uStack_5f0;
        uStack_5f0._4_4_ = (float)((ulong)uStack_7f0 >> 0x20);
        fStack_8c = uStack_5f0._4_4_;
        uStack_5e8._0_4_ = (float)uStack_7e8;
        fStack_88 = (float)uStack_5e8;
        uStack_5e8._4_4_ = (float)((ulong)uStack_7e8 >> 0x20);
        fStack_104 = uStack_5e8._4_4_;
        uVar5 = local_280._0_8_;
        uVar6 = local_280._8_8_;
        uVar7 = local_280._16_8_;
        uVar8 = local_280._24_8_;
        local_c0._0_4_ = auVar3._0_4_;
        local_c0._4_4_ = auVar3._4_4_;
        uStack_b8._0_4_ = auVar3._8_4_;
        uStack_b8._4_4_ = auVar3._12_4_;
        uStack_b0._0_4_ = auVar1._0_4_;
        uStack_b0._4_4_ = auVar1._4_4_;
        uStack_a8._0_4_ = auVar1._8_4_;
        local_120 = (float)local_600 * (float)local_c0;
        fStack_11c = local_600._4_4_ * local_c0._4_4_;
        fStack_118 = (float)uStack_5f8 * (float)uStack_b8;
        fStack_114 = uStack_5f8._4_4_ * uStack_b8._4_4_;
        fStack_110 = (float)uStack_5f0 * (float)uStack_b0;
        fStack_10c = uStack_5f0._4_4_ * uStack_b0._4_4_;
        fStack_108 = (float)uStack_5e8 * (float)uStack_a8;
        local_140._0_4_ = local_2c0._0_4_;
        local_140._4_4_ = local_2c0._4_4_;
        uStack_138._0_4_ = local_2c0._8_4_;
        uStack_138._4_4_ = local_2c0._12_4_;
        uStack_130._0_4_ = auStack_2b0._0_4_;
        uStack_130._4_4_ = auStack_2b0._4_4_;
        uStack_128._0_4_ = auStack_2b0._8_4_;
        uStack_128._4_4_ = auStack_2b0._12_4_;
        local_820._4_4_ = fStack_11c + local_140._4_4_;
        local_820._0_4_ = local_120 + (float)local_140;
        uStack_818._0_4_ = fStack_118 + (float)uStack_138;
        uStack_818._4_4_ = fStack_114 + uStack_138._4_4_;
        uStack_810._0_4_ = fStack_110 + (float)uStack_130;
        uStack_810._4_4_ = fStack_10c + uStack_130._4_4_;
        auVar18 = _local_820;
        uStack_808._0_4_ = fStack_108 + (float)uStack_128;
        uStack_808._4_4_ = uStack_5e8._4_4_ + uStack_128._4_4_;
        auVar22 = _local_820;
        local_580 = local_820;
        uStack_578 = uStack_818;
        uStack_810 = auVar18._16_8_;
        uStack_570 = uStack_810;
        uStack_808 = auVar22._24_8_;
        uStack_568 = uStack_808;
        local_5a0 = local_340._0_8_;
        uStack_598 = local_340._8_8_;
        uStack_590 = auStack_330._0_8_;
        uStack_588 = auStack_330._8_8_;
        auVar15._16_8_ = uStack_810;
        auVar15._0_16_ = _local_820;
        auVar15._24_8_ = uStack_808;
        auVar14._16_8_ = auStack_330._0_8_;
        auVar14._0_16_ = local_340;
        auVar14._24_8_ = auStack_330._8_8_;
        auVar22 = vmaxps_avx(auVar15,auVar14);
        local_820 = auVar22._0_8_;
        local_500 = local_820;
        uStack_818 = auVar22._8_8_;
        uStack_4f8 = uStack_818;
        uStack_810 = auVar22._16_8_;
        uStack_4f0 = uStack_810;
        uStack_808 = auVar22._24_8_;
        uStack_4e8 = uStack_808;
        local_520 = local_300._0_8_;
        uStack_518 = local_300._8_8_;
        uStack_510 = local_300._16_8_;
        uStack_508 = local_300._24_8_;
        auVar17._16_8_ = local_300._16_8_;
        auVar17._0_16_ = auVar2;
        auVar17._24_8_ = local_300._24_8_;
        _local_820 = vminps_avx(auVar22,auVar17);
        local_468 = local_710;
        local_4a0 = local_820;
        uStack_498 = uStack_818;
        uStack_490 = uStack_810;
        uStack_488 = uStack_808;
        *(undefined1 (*) [8])local_710 = local_820;
        *(undefined8 *)(local_710 + 2) = uStack_818;
        *(undefined8 *)(local_710 + 4) = uStack_810;
        *(undefined8 *)(local_710 + 6) = uStack_808;
        local_710 = local_710 + 8;
        local_600 = local_800;
        uStack_5f8 = uStack_7f8;
        uStack_5f0 = uStack_7f0;
        uStack_5e8 = uStack_7e8;
        local_2a0 = local_6bc;
        local_29c = local_6bc;
        local_298 = local_6bc;
        local_294 = local_6bc;
        local_290 = local_6bc;
        local_28c = local_6bc;
        local_288 = local_6bc;
        local_284 = local_6bc;
        local_280 = auVar21;
        local_260 = local_6c0;
        local_25c = local_6c0;
        local_258 = local_6c0;
        local_254 = local_6c0;
        local_250 = local_6c0;
        local_24c = local_6c0;
        local_248 = local_6c0;
        local_244 = local_6c0;
        local_140 = local_2c0._0_8_;
        uStack_138 = local_2c0._8_8_;
        uStack_130 = auStack_2b0._0_8_;
        uStack_128 = auStack_2b0._8_8_;
        local_c0 = uVar5;
        uStack_b8 = uVar6;
        uStack_b0 = uVar7;
        uStack_a8 = uVar8;
        fStack_84 = fStack_104;
      }
      local_300 = auVar20;
    }
  }
  else if (local_704 == 4) {
    local_704 = 4;
    for (local_824 = 0; local_824 < local_6fc; local_824 = local_824 + 1) {
      this_00 = &local_878;
      Mat::channel(in_stack_fffffffffffff610,(int)((ulong)this_00 >> 0x20));
      in_stack_fffffffffffff610 = (Mat *)Mat::operator_cast_to_float_(this_00);
      Mat::~Mat((Mat *)0x8ce16e);
      local_3ec = 0;
      local_400 = 0;
      uStack_3fc = 0;
      uStack_3f8 = 0;
      uStack_3f4 = 0;
      local_890 = 0;
      uStack_888 = 0;
      local_404 = 0x3f800000;
      local_420 = 0x3f800000;
      uStack_41c = 0x3f800000;
      uStack_418 = 0x3f800000;
      uStack_414 = 0x3f800000;
      local_8a0 = 0x3f8000003f800000;
      uStack_898 = 0x3f8000003f800000;
      local_830 = in_stack_fffffffffffff610;
      for (local_8a4 = 0; local_8a4 < local_700; local_8a4 = local_8a4 + 1) {
        local_3e8 = local_830;
        local_8c0 = local_830->data;
        piStack_8b8 = local_830->refcount;
        local_440 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        local_3e0 = CONCAT44(local_440,local_440);
        uStack_3d8 = CONCAT44(local_440,local_440);
        local_460 = *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_3c0 = CONCAT44(local_460,local_460);
        uStack_3b8 = CONCAT44(local_460,local_460);
        local_3b0._0_4_ = SUB84(local_8c0,0);
        local_3b0._4_4_ = (float)((ulong)local_8c0 >> 0x20);
        uStack_3a8._0_4_ = SUB84(piStack_8b8,0);
        uStack_3a8._4_4_ = (float)((ulong)piStack_8b8 >> 0x20);
        local_3d0 = (float)local_3b0 * local_460;
        fStack_3cc = local_3b0._4_4_ * local_460;
        fStack_3c8 = (float)uStack_3a8 * local_460;
        fStack_3c4 = uStack_3a8._4_4_ * local_460;
        local_8d0._4_4_ = fStack_3cc + local_440;
        local_8d0._0_4_ = local_3d0 + local_440;
        uStack_8c8._0_4_ = fStack_3c8 + local_440;
        uStack_8c8._4_4_ = fStack_3c4 + local_440;
        local_390 = local_8d0;
        uStack_388 = uStack_8c8;
        auVar1._8_8_ = uStack_8c8;
        auVar1._0_8_ = local_8d0;
        auVar1 = vmaxps_avx(auVar1,ZEXT816(0));
        local_8d0 = auVar1._0_8_;
        local_370 = local_8d0;
        uStack_8c8 = auVar1._8_8_;
        uStack_368 = uStack_8c8;
        auVar2._8_8_ = 0x3f8000003f800000;
        auVar2._0_8_ = 0x3f8000003f800000;
        _local_8d0 = vminps_avx(auVar1,auVar2);
        local_348 = local_830;
        local_360 = (void *)local_8d0;
        piStack_358 = uStack_8c8;
        local_830->data = (void *)local_8d0;
        local_830->refcount = uStack_8c8;
        local_830 = (Mat *)&local_830->elemsize;
        fStack_45c = local_460;
        fStack_458 = local_460;
        fStack_454 = local_460;
        local_444 = local_460;
        fStack_43c = local_440;
        fStack_438 = local_440;
        fStack_434 = local_440;
        local_424 = local_440;
        local_3b0 = local_8c0;
        uStack_3a8 = piStack_8b8;
        local_3a0 = local_890;
        uStack_398 = uStack_888;
        local_380 = local_8a0;
        uStack_378 = uStack_898;
      }
    }
  }
  else {
    for (local_8d4 = 0; local_8d4 < local_6fc; local_8d4 = local_8d4 + 1) {
      Mat::channel(in_stack_fffffffffffff610,(int)((ulong)in_stack_fffffffffffff608 >> 0x20));
      pfVar19 = Mat::operator_cast_to_float_(&local_928);
      Mat::~Mat((Mat *)0x8ce490);
      local_92c = 0;
      local_6c4 = 0;
      local_204 = 0;
      local_208 = 0;
      local_20c = 0;
      local_210 = 0;
      local_214 = 0;
      local_218 = 0;
      local_21c = 0;
      local_220 = 0;
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      local_240 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0),0x20);
      auStack_230 = vinsertps_avx(auVar1,ZEXT416(0),0x30);
      local_6c8 = 0x3f800000;
      local_1c4 = 0x3f800000;
      local_1c8 = 0x3f800000;
      local_1cc = 0x3f800000;
      local_1d0 = 0x3f800000;
      local_1d4 = 0x3f800000;
      local_1d8 = 0x3f800000;
      local_1dc = 0x3f800000;
      local_1e0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
      auVar22._16_16_ = auVar1;
      auVar22._0_16_ = auVar2;
      local_200._0_8_ = auVar2._0_8_;
      local_200._8_8_ = auVar2._8_8_;
      local_200._16_8_ = auVar1._0_8_;
      local_200._24_8_ = auVar1._8_8_;
      local_8e0 = pfVar19;
      for (; local_92c + 7 < local_700; local_92c = local_92c + 8) {
        local_6b0 = local_8e0;
        uVar5 = *(undefined8 *)local_8e0;
        uVar6 = *(undefined8 *)(local_8e0 + 2);
        uVar7 = *(undefined8 *)(local_8e0 + 4);
        uVar8 = *(undefined8 *)(local_8e0 + 6);
        local_6cc = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
        auVar1 = vinsertps_avx(ZEXT416(local_6cc),ZEXT416(local_6cc),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6cc),0x20);
        local_1c0 = vinsertps_avx(auVar1,ZEXT416(local_6cc),0x30);
        auVar1 = vinsertps_avx(ZEXT416(local_6cc),ZEXT416(local_6cc),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6cc),0x20);
        auStack_1b0 = vinsertps_avx(auVar1,ZEXT416(local_6cc),0x30);
        local_6d0 = *(uint *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        auVar1 = vinsertps_avx(ZEXT416(local_6d0),ZEXT416(local_6d0),0x10);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6d0),0x20);
        auVar1 = vinsertps_avx(auVar1,ZEXT416(local_6d0),0x30);
        auVar3 = vinsertps_avx(ZEXT416(local_6d0),ZEXT416(local_6d0),0x10);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_6d0),0x20);
        auVar3 = vinsertps_avx(auVar3,ZEXT416(local_6d0),0x30);
        auVar23._16_16_ = auVar1;
        auVar23._0_16_ = auVar3;
        local_180._0_8_ = auVar3._0_8_;
        local_680 = local_180._0_8_;
        local_180._8_8_ = auVar3._8_8_;
        uStack_678 = local_180._8_8_;
        local_180._16_8_ = auVar1._0_8_;
        uStack_670 = local_180._16_8_;
        local_180._24_8_ = auVar1._8_8_;
        uStack_668 = local_180._24_8_;
        local_6a0 = local_1c0._0_8_;
        uStack_698 = local_1c0._8_8_;
        uStack_690 = auStack_1b0._0_8_;
        uStack_688 = auStack_1b0._8_8_;
        local_660._0_4_ = (float)uVar5;
        local_60 = (float)local_660;
        local_660._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fStack_5c = local_660._4_4_;
        uStack_658._0_4_ = (float)uVar6;
        fStack_58 = (float)uStack_658;
        uStack_658._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fStack_54 = uStack_658._4_4_;
        uStack_650._0_4_ = (float)uVar7;
        fStack_50 = (float)uStack_650;
        uStack_650._4_4_ = (float)((ulong)uVar7 >> 0x20);
        fStack_4c = uStack_650._4_4_;
        uStack_648._0_4_ = (float)uVar8;
        fStack_48 = (float)uStack_648;
        uStack_648._4_4_ = (float)((ulong)uVar8 >> 0x20);
        fStack_c4 = uStack_648._4_4_;
        uVar9 = local_180._0_8_;
        uVar10 = local_180._8_8_;
        uVar11 = local_180._16_8_;
        uVar12 = local_180._24_8_;
        local_80._0_4_ = auVar3._0_4_;
        local_80._4_4_ = auVar3._4_4_;
        uStack_78._0_4_ = auVar3._8_4_;
        uStack_78._4_4_ = auVar3._12_4_;
        uStack_70._0_4_ = auVar1._0_4_;
        uStack_70._4_4_ = auVar1._4_4_;
        uStack_68._0_4_ = auVar1._8_4_;
        local_e0 = (float)local_660 * (float)local_80;
        fStack_dc = local_660._4_4_ * local_80._4_4_;
        fStack_d8 = (float)uStack_658 * (float)uStack_78;
        fStack_d4 = uStack_658._4_4_ * uStack_78._4_4_;
        fStack_d0 = (float)uStack_650 * (float)uStack_70;
        fStack_cc = uStack_650._4_4_ * uStack_70._4_4_;
        fStack_c8 = (float)uStack_648 * (float)uStack_68;
        local_100._0_4_ = local_1c0._0_4_;
        local_100._4_4_ = local_1c0._4_4_;
        uStack_f8._0_4_ = local_1c0._8_4_;
        uStack_f8._4_4_ = local_1c0._12_4_;
        uStack_f0._0_4_ = auStack_1b0._0_4_;
        uStack_f0._4_4_ = auStack_1b0._4_4_;
        uStack_e8._0_4_ = auStack_1b0._8_4_;
        uStack_e8._4_4_ = auStack_1b0._12_4_;
        local_9c0._4_4_ = fStack_dc + local_100._4_4_;
        local_9c0._0_4_ = local_e0 + (float)local_100;
        uStack_9b8._0_4_ = fStack_d8 + (float)uStack_f8;
        uStack_9b8._4_4_ = fStack_d4 + uStack_f8._4_4_;
        uStack_9b0._0_4_ = fStack_d0 + (float)uStack_f0;
        uStack_9b0._4_4_ = fStack_cc + uStack_f0._4_4_;
        auVar18 = _local_9c0;
        uStack_9a8._0_4_ = fStack_c8 + (float)uStack_e8;
        uStack_9a8._4_4_ = uStack_648._4_4_ + uStack_e8._4_4_;
        auVar4 = _local_9c0;
        local_5c0 = local_9c0;
        uStack_5b8 = uStack_9b8;
        uStack_9b0 = auVar18._16_8_;
        uStack_5b0 = uStack_9b0;
        uStack_9a8 = auVar4._24_8_;
        uStack_5a8 = uStack_9a8;
        local_5e0 = local_240._0_8_;
        uStack_5d8 = local_240._8_8_;
        uStack_5d0 = auStack_230._0_8_;
        uStack_5c8 = auStack_230._8_8_;
        auVar13._16_8_ = uStack_9b0;
        auVar13._0_16_ = _local_9c0;
        auVar13._24_8_ = uStack_9a8;
        auVar4._16_8_ = auStack_230._0_8_;
        auVar4._0_16_ = local_240;
        auVar4._24_8_ = auStack_230._8_8_;
        auVar4 = vmaxps_avx(auVar13,auVar4);
        local_9c0 = auVar4._0_8_;
        local_540 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_538 = uStack_9b8;
        uStack_9b0 = auVar4._16_8_;
        uStack_530 = uStack_9b0;
        uStack_9a8 = auVar4._24_8_;
        uStack_528 = uStack_9a8;
        local_560 = local_200._0_8_;
        uStack_558 = local_200._8_8_;
        uStack_550 = local_200._16_8_;
        uStack_548 = local_200._24_8_;
        auVar16._16_8_ = local_200._16_8_;
        auVar16._0_16_ = auVar2;
        auVar16._24_8_ = local_200._24_8_;
        auVar4 = vminps_avx(auVar4,auVar16);
        local_4a8 = local_8e0;
        local_9c0 = auVar4._0_8_;
        local_4e0 = local_9c0;
        uStack_9b8 = auVar4._8_8_;
        uStack_4d8 = uStack_9b8;
        uStack_9b0 = auVar4._16_8_;
        uStack_4d0 = uStack_9b0;
        uStack_9a8 = auVar4._24_8_;
        uStack_4c8 = uStack_9a8;
        *(undefined1 (*) [8])local_8e0 = local_9c0;
        *(undefined8 *)(local_8e0 + 2) = uStack_9b8;
        *(undefined8 *)(local_8e0 + 4) = uStack_9b0;
        *(undefined8 *)(local_8e0 + 6) = uStack_9a8;
        local_8e0 = local_8e0 + 8;
        local_660 = uVar5;
        uStack_658 = uVar6;
        uStack_650 = uVar7;
        uStack_648 = uVar8;
        local_1a0 = local_6cc;
        local_19c = local_6cc;
        local_198 = local_6cc;
        local_194 = local_6cc;
        local_190 = local_6cc;
        local_18c = local_6cc;
        local_188 = local_6cc;
        local_184 = local_6cc;
        local_180 = auVar23;
        local_160 = local_6d0;
        local_15c = local_6d0;
        local_158 = local_6d0;
        local_154 = local_6d0;
        local_150 = local_6d0;
        local_14c = local_6d0;
        local_148 = local_6d0;
        local_144 = local_6d0;
        local_100 = local_1c0._0_8_;
        uStack_f8 = local_1c0._8_8_;
        uStack_f0 = auStack_1b0._0_8_;
        uStack_e8 = auStack_1b0._8_8_;
        local_80 = uVar9;
        uStack_78 = uVar10;
        uStack_70 = uVar11;
        uStack_68 = uVar12;
        fStack_44 = fStack_c4;
      }
      for (; local_92c < local_700; local_92c = local_92c + 1) {
        if (*(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) <= *local_8e0) {
          if (*local_8e0 <= *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)) {
            *local_8e0 = *local_8e0 * *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) +
                         *(float *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
          }
          else {
            *local_8e0 = 1.0;
          }
        }
        else {
          *local_8e0 = 0.0;
        }
        local_8e0 = local_8e0 + 1;
      }
      local_200 = auVar22;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ++ptr;
        }
    }

    return 0;
}